

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger_impl.h
# Opt level: O1

void __thiscall
spdlog::async_logger::_set_formatter(async_logger *this,formatter_ptr *msg_formatter)

{
  async_log_helper *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  formatter *__tmp;
  
  (this->super_logger)._formatter.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (msg_formatter->super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_logger)._formatter.
              super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(msg_formatter->super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  paVar1 = (this->_async_log_helper)._M_t.
           super___uniq_ptr_impl<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
           ._M_t.
           super__Tuple_impl<0UL,_spdlog::details::async_log_helper_*,_std::default_delete<spdlog::details::async_log_helper>_>
           .super__Head_base<0UL,_spdlog::details::async_log_helper_*,_false>._M_head_impl;
  peVar2 = (this->super_logger)._formatter.
           super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->super_logger)._formatter.
           super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (paVar1->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(paVar1->_formatter).
                    super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(paVar1->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2> + 8
  ))->_M_pi = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

inline void spdlog::async_logger::_set_formatter(spdlog::formatter_ptr msg_formatter)
{
    _formatter = msg_formatter;
    _async_log_helper->set_formatter(_formatter);
}